

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  undefined8 *puVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  archive_read *a_00;
  char *pcVar5;
  size_t sVar6;
  archive_entry *entry_00;
  int *piVar7;
  undefined4 uVar8;
  archive_entry *in_RSI;
  archive *in_RDI;
  wchar_t err;
  char *signature;
  uchar *p;
  lha *lha;
  archive_string pathname;
  archive_string linkname;
  archive_entry *in_stack_ffffffffffffff78;
  archive_read *in_stack_ffffffffffffff80;
  archive_string *in_stack_ffffffffffffff88;
  archive *a_01;
  undefined4 in_stack_ffffffffffffff98;
  wchar_t in_stack_ffffffffffffff9c;
  archive_read *a_02;
  archive_entry *entry_01;
  lha *lha_00;
  wchar_t local_4;
  
  in_RDI->archive_format = 0xb0000;
  if (in_RDI->archive_format_name == (char *)0x0) {
    in_RDI->archive_format_name = "lha";
  }
  puVar1 = *(undefined8 **)in_RDI[0x15].archive_format_name;
  *(undefined1 *)((long)puVar1 + 0x123) = 0;
  *(undefined1 *)((long)puVar1 + 0x124) = 0;
  *(undefined1 *)((long)puVar1 + 0x125) = 0;
  puVar1[2] = 0;
  a_00 = (archive_read *)
         __archive_read_ahead
                   (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(ssize_t *)0x13c3f1)
  ;
  if (a_00 == (archive_read *)0x0) {
    pcVar5 = (char *)__archive_read_ahead
                               (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                                (ssize_t *)0x13c40f);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      wVar2 = truncated_error((archive_read *)0x13c443);
      return wVar2;
    }
    return L'\x01';
  }
  if (((*(char *)((long)puVar1 + 0x121) == '\0') && ((char)(a_00->archive).magic == 'M')) &&
     (*(char *)((long)&(a_00->archive).magic + 1) == 'Z')) {
    in_stack_ffffffffffffff9c = lha_skip_sfx(a_00);
    if (in_stack_ffffffffffffff9c < L'\xffffffec') {
      return in_stack_ffffffffffffff9c;
    }
    a_00 = (archive_read *)
           __archive_read_ahead
                     (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                      (ssize_t *)0x13c4bd);
    if (a_00 == (archive_read *)0x0) {
      wVar2 = truncated_error((archive_read *)0x13c4d2);
      return wVar2;
    }
  }
  if ((char)(a_00->archive).magic == '\0') {
    local_4 = L'\x01';
  }
  else {
    a_02 = a_00;
    sVar6 = lha_check_header_format(a_00);
    if (sVar6 == 0) {
      *(undefined1 *)((long)puVar1 + 0x121) = 1;
      puVar1[4] = 0;
      *(undefined1 *)(puVar1 + 5) = (a_02->archive).field_0x14;
      *(undefined1 *)((long)puVar1 + 0x29) = *(undefined1 *)((long)&(a_02->archive).magic + 3);
      *(char *)((long)puVar1 + 0x2a) = (char)(a_02->archive).state;
      *(undefined1 *)((long)puVar1 + 0x2b) = *(undefined1 *)((long)&(a_02->archive).state + 1);
      iVar3 = memcmp((void *)((long)puVar1 + 0x29),"lhd",3);
      if (iVar3 == 0) {
        *(undefined1 *)((long)puVar1 + 0x122) = 1;
      }
      else {
        *(undefined1 *)((long)puVar1 + 0x122) = 0;
      }
      iVar3 = memcmp((void *)((long)puVar1 + 0x29),"lh0",3);
      if ((iVar3 == 0) || (iVar3 = memcmp((void *)((long)puVar1 + 0x29),"lz4",3), iVar3 == 0)) {
        *(undefined1 *)((long)puVar1 + 0x126) = 0;
      }
      else {
        *(undefined1 *)((long)puVar1 + 0x126) = 1;
      }
      puVar1[6] = 0;
      puVar1[7] = 0;
      *(undefined4 *)(puVar1 + 8) = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      puVar1[0xc] = 0;
      puVar1[0xd] = 0;
      puVar1[0xe] = 0;
      uVar8 = 0x1b6;
      if (*(char *)((long)puVar1 + 0x122) != '\0') {
        uVar8 = 0x1ff;
      }
      *(undefined4 *)(puVar1 + 0xf) = uVar8;
      puVar1[0x10] = 0;
      puVar1[0x11] = 0;
      puVar1[0x1c] = 0;
      puVar1[0x1f] = 0;
      *(undefined1 *)(puVar1 + 0x24) = 0;
      if (puVar1[0x1a] == 0) {
        puVar1[0x19] = 0;
      }
      else {
        puVar1[0x19] = puVar1[0x1a];
      }
      entry_00 = (archive_entry *)(ulong)(byte)(a_02->archive).field_0x14;
      switch(entry_00) {
      case (archive_entry *)0x0:
        local_4 = lha_read_file_header_0
                            ((archive_read *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (lha *)entry_00);
        break;
      case (archive_entry *)0x1:
        local_4 = lha_read_file_header_1(a_02,(lha *)a_00);
        break;
      case (archive_entry *)0x2:
        local_4 = lha_read_file_header_2
                            ((archive_read *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (lha *)entry_00);
        break;
      case (archive_entry *)0x3:
        local_4 = lha_read_file_header_3
                            ((archive_read *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (lha *)entry_00);
        break;
      default:
        archive_set_error(in_RDI,0x54,"Unsupported LHa header level %d",
                          (ulong)(byte)(a_02->archive).field_0x14);
        local_4 = L'\xffffffe2';
      }
      if (L'\xffffffeb' < local_4) {
        if ((*(char *)((long)puVar1 + 0x122) == '\0') && (puVar1[0x1f] == 0)) {
          local_4 = truncated_error((archive_read *)0x13c828);
        }
        else {
          archive_string_concat
                    ((archive_string *)in_stack_ffffffffffffff80,
                     (archive_string *)in_stack_ffffffffffffff78);
          entry_01 = (archive_entry *)0x0;
          lha_00 = (lha *)0x0;
          archive_string_concat
                    ((archive_string *)in_stack_ffffffffffffff80,
                     (archive_string *)in_stack_ffffffffffffff78);
          if ((*(uint *)(puVar1 + 0xf) & 0xf000) == 0xa000) {
            wVar2 = lha_parse_linkname(in_stack_ffffffffffffff88,
                                       (archive_string *)in_stack_ffffffffffffff80);
            if (wVar2 == L'\0') {
              archive_set_error(in_RDI,0x54,"Unknown symlink-name");
              archive_string_free((archive_string *)0x13c8f2);
              archive_string_free((archive_string *)0x13c8fc);
              return L'\xffffffe7';
            }
          }
          else {
            uVar4 = 0x8000;
            if (*(char *)((long)puVar1 + 0x122) != '\0') {
              uVar4 = 0x4000;
            }
            *(uint *)(puVar1 + 0xf) = *(uint *)(puVar1 + 0xf) & 0xffff0fff | uVar4;
          }
          if (((*(uint *)(puVar1 + 8) & 4) == 0) && ((*(byte *)(puVar1 + 0x24) & 1) != 0)) {
            *(uint *)(puVar1 + 0xf) = *(uint *)(puVar1 + 0xf) & 0xffffff6d;
          }
          wVar2 = _archive_entry_copy_pathname_l
                            (entry_00,(char *)in_stack_ffffffffffffff88,
                             (size_t)in_stack_ffffffffffffff80,
                             (archive_string_conv *)in_stack_ffffffffffffff78);
          if (wVar2 != L'\0') {
            piVar7 = __errno_location();
            if (*piVar7 == 0xc) {
              archive_set_error(in_RDI,0xc,"Can\'t allocate memory for Pathname");
              return L'\xffffffe2';
            }
            a_01 = in_RDI;
            pcVar5 = archive_string_conversion_charset_name((archive_string_conv *)puVar1[0x19]);
            archive_set_error(a_01,0x54,"Pathname cannot be converted from %s to current locale.",
                              pcVar5);
            local_4 = L'\xffffffec';
          }
          archive_string_free((archive_string *)0x13ca16);
          archive_entry_set_symlink
                    ((archive_entry *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
          archive_string_free((archive_string *)0x13cad1);
          if ((a_02->archive).field_0x14 == '\0') {
            lha_replace_path_separator(lha_00,entry_01);
          }
          archive_entry_set_mode(in_RSI,*(mode_t *)(puVar1 + 0xf));
          archive_entry_set_uid(in_RSI,puVar1[0x10]);
          archive_entry_set_gid(in_RSI,puVar1[0x11]);
          if (puVar1[0x13] != 0) {
            archive_entry_set_uname
                      ((archive_entry *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78)
            ;
          }
          if (puVar1[0x16] != 0) {
            archive_entry_set_gname
                      ((archive_entry *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78)
            ;
          }
          if ((*(uint *)(puVar1 + 8) & 1) == 0) {
            archive_entry_unset_birthtime((archive_entry *)0x13cbca);
            archive_entry_unset_ctime((archive_entry *)0x13cbd4);
          }
          else {
            archive_entry_set_birthtime(in_RSI,puVar1[9],puVar1[10]);
            archive_entry_set_ctime(in_RSI,puVar1[9],puVar1[10]);
          }
          archive_entry_set_mtime(in_RSI,puVar1[0xb],puVar1[0xc]);
          if ((*(uint *)(puVar1 + 8) & 2) == 0) {
            archive_entry_unset_atime((archive_entry *)0x13cc28);
          }
          else {
            archive_entry_set_atime(in_RSI,puVar1[0xd],puVar1[0xe]);
          }
          if ((*(char *)((long)puVar1 + 0x122) == '\0') &&
             (pcVar5 = archive_entry_symlink(in_stack_ffffffffffffff78), pcVar5 == (char *)0x0)) {
            archive_entry_set_size(in_RSI,puVar1[7]);
          }
          else {
            archive_entry_unset_size((archive_entry *)0x13cc53);
          }
          puVar1[1] = puVar1[6];
          *puVar1 = 0;
          *(undefined2 *)(puVar1 + 3) = 0;
          if ((*(char *)((long)puVar1 + 0x122) != '\0') || (puVar1[6] == 0)) {
            *(undefined1 *)((long)puVar1 + 0x124) = 1;
          }
          sprintf((char *)(puVar1 + 0x27),"lha -%c%c%c-",
                  (ulong)(uint)(int)*(char *)((long)puVar1 + 0x29),
                  (ulong)(uint)(int)*(char *)((long)puVar1 + 0x2a),
                  (ulong)(uint)(int)*(char *)((long)puVar1 + 0x2b));
          in_RDI->archive_format_name = (char *)(puVar1 + 0x27);
        }
      }
    }
    else {
      archive_set_error(in_RDI,0x54,"Bad LHa file");
      local_4 = L'\xffffffe2';
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_string linkname;
	struct archive_string pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	
	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL)
		lha->sconv = lha->opt_sconv;
	else
		lha->sconv = NULL;

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename.
	 */
	archive_string_concat(&lha->dirname, &lha->filename);
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_copy(&pathname, &lha->dirname);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_string_free(&pathname);
			archive_string_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	if (archive_entry_copy_pathname_l(entry, pathname.s,
	    pathname.length, lha->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(lha->sconv));
		err = ARCHIVE_WARN;
	}
	archive_string_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		if (archive_entry_copy_symlink_l(entry, linkname.s,
		    linkname.length, lha->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(lha->sconv));
			err = ARCHIVE_WARN;
		}
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_string_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	sprintf(lha->format_name, "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}